

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O3

void LDLSolve(c_float *x,c_float *b,csc *L,c_float *Dinv,c_int *P,c_float *bp)

{
  long lVar1;
  long lVar2;
  
  lVar1 = L->n;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      bp[lVar2] = b[P[lVar2]];
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  QDLDL_solve(lVar1,L->p,L->i,L->x,Dinv,bp);
  lVar1 = L->n;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      x[P[lVar2]] = bp[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return;
}

Assistant:

static void LDLSolve(c_float *x, c_float *b, const csc *L, const c_float *Dinv, const c_int *P, c_float *bp) {
    /* solves P'LDL'P x = b for x */
    permute_x(L->n, bp, b, P);
    QDLDL_solve(L->n, L->p, L->i, L->x, Dinv, bp);
    permutet_x(L->n, x, bp, P);

}